

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# estring.cpp
# Opt level: O2

Vec3f __thiscall embree::string_to_Vec3f(embree *this,string *str)

{
  float fVar1;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  Vec3f VVar3;
  size_t next;
  string local_48 [32];
  
  next = 0;
  fVar1 = std::__cxx11::stof(str,&next);
  std::__cxx11::string::substr((ulong)local_48,(ulong)str);
  std::__cxx11::string::operator=((string *)str,local_48);
  std::__cxx11::string::~string(local_48);
  fVar2 = std::__cxx11::stof(str,&next);
  std::__cxx11::string::substr((ulong)local_48,(ulong)str);
  std::__cxx11::string::operator=((string *)str,local_48);
  std::__cxx11::string::~string(local_48);
  VVar3.field_0._0_4_ = std::__cxx11::stof(str,&next);
  VVar3.field_0.field_0.y = (float)extraout_XMM0_Db;
  *(float *)this = fVar1;
  *(float *)(this + 4) = fVar2;
  *(float *)(this + 8) = VVar3.field_0._0_4_;
  VVar3.field_0.field_0.z = fVar2;
  return (Vec3f)VVar3.field_0;
}

Assistant:

Vec3f string_to_Vec3f ( std::string str )
  {
    size_t next = 0;
    const float x = std::stof(str,&next); str = str.substr(next+1);
    const float y = std::stof(str,&next); str = str.substr(next+1);
    const float z = std::stof(str,&next); 
    return Vec3f(x,y,z);
  }